

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

FT_Error cid_parse_font_matrix(CID_Face face,CID_Parser *parser)

{
  int iVar1;
  CID_FaceDict pCVar2;
  FT_Int FVar3;
  FT_Long FVar4;
  bool bVar5;
  long local_90;
  FT_Int result;
  FT_Vector *offset;
  FT_Matrix *matrix;
  FT_Fixed temp_scale;
  FT_Fixed temp [6];
  FT_Face root;
  CID_FaceDict dict;
  CID_Parser *parser_local;
  CID_Face face_local;
  
  if ((-1 < parser->num_dict) && (parser->num_dict < (face->cid).num_dicts)) {
    pCVar2 = (face->cid).font_dicts;
    iVar1 = parser->num_dict;
    FVar3 = (*(parser->root).funcs.to_fixed_array)(&parser->root,6,&temp_scale,3);
    if (FVar3 < 6) {
      return 3;
    }
    if (temp[2] < 0) {
      local_90 = -temp[2];
    }
    else {
      local_90 = temp[2];
    }
    if (local_90 == 0) {
      return 3;
    }
    if (local_90 != 0x10000) {
      FVar4 = FT_DivFix(1000,local_90);
      (face->root).units_per_EM = (FT_UShort)FVar4;
      temp_scale = FT_DivFix(temp_scale,local_90);
      temp[0] = FT_DivFix(temp[0],local_90);
      temp[1] = FT_DivFix(temp[1],local_90);
      temp[3] = FT_DivFix(temp[3],local_90);
      temp[4] = FT_DivFix(temp[4],local_90);
      bVar5 = temp[2] < 0;
      temp[2] = 0x10000;
      if (bVar5) {
        temp[2] = -0x10000;
      }
    }
    pCVar2[iVar1].font_matrix.xx = temp_scale;
    pCVar2[iVar1].font_matrix.yx = temp[0];
    pCVar2[iVar1].font_matrix.xy = temp[1];
    pCVar2[iVar1].font_matrix.yy = temp[2];
    pCVar2[iVar1].font_offset.x = temp[3] >> 0x10;
    pCVar2[iVar1].font_offset.y = temp[4] >> 0x10;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_parse_font_matrix( CID_Face     face,
                         CID_Parser*  parser )
  {
    CID_FaceDict  dict;
    FT_Face       root = (FT_Face)&face->root;
    FT_Fixed      temp[6];
    FT_Fixed      temp_scale;


    if ( parser->num_dict >= 0 && parser->num_dict < face->cid.num_dicts )
    {
      FT_Matrix*  matrix;
      FT_Vector*  offset;
      FT_Int      result;


      dict   = face->cid.font_dicts + parser->num_dict;
      matrix = &dict->font_matrix;
      offset = &dict->font_offset;

      /* input is scaled by 1000 to accommodate default FontMatrix */
      result = cid_parser_to_fixed_array( parser, 6, temp, 3 );

      if ( result < 6 )
        return FT_THROW( Invalid_File_Format );

      temp_scale = FT_ABS( temp[3] );

      if ( temp_scale == 0 )
      {
        FT_ERROR(( "cid_parse_font_matrix: invalid font matrix\n" ));
        return FT_THROW( Invalid_File_Format );
      }

      /* atypical case */
      if ( temp_scale != 0x10000L )
      {
        /* set units per EM based on FontMatrix values */
        root->units_per_EM = (FT_UShort)FT_DivFix( 1000, temp_scale );

        temp[0] = FT_DivFix( temp[0], temp_scale );
        temp[1] = FT_DivFix( temp[1], temp_scale );
        temp[2] = FT_DivFix( temp[2], temp_scale );
        temp[4] = FT_DivFix( temp[4], temp_scale );
        temp[5] = FT_DivFix( temp[5], temp_scale );
        temp[3] = temp[3] < 0 ? -0x10000L : 0x10000L;
      }

      matrix->xx = temp[0];
      matrix->yx = temp[1];
      matrix->xy = temp[2];
      matrix->yy = temp[3];

      /* note that the font offsets are expressed in integer font units */
      offset->x  = temp[4] >> 16;
      offset->y  = temp[5] >> 16;
    }

    return FT_Err_Ok;
  }